

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O3

bool __thiscall Clasp::Cli::ConfigIter::next(ConfigIter *this)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  __s = this->base_;
  sVar1 = strlen(__s);
  sVar2 = strlen(__s + sVar1 + 2);
  this->base_ = __s + sVar2 + sVar1 + 4;
  sVar3 = strlen(__s + sVar2 + sVar1 + 4);
  this->base_ = __s + sVar3 + sVar2 + sVar1 + 5;
  return __s[sVar3 + sVar2 + sVar1 + 5] != '\0';
}

Assistant:

bool        ConfigIter::next()       {
	base_ = args();
	base_+= std::strlen(base_) + 1;
	return valid();
}